

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pShaderCompilationCases.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles2::Performance::InvalidShaderCompilerCase::iterate(InvalidShaderCompilerCase *this)

{
  TestContext *this_00;
  _Alloc_hider _Var1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined4 uVar4;
  pointer *pplVar5;
  bool bVar6;
  int iVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  undefined4 extraout_var;
  long lVar9;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  deUint64 dVar10;
  undefined4 extraout_var_06;
  deUint64 dVar11;
  undefined4 extraout_var_07;
  deUint64 dVar12;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  size_type *psVar14;
  pointer *pplVar15;
  int precision;
  long *plVar16;
  pointer *pplVar17;
  char *pcVar18;
  ShaderValidity validity;
  uint uVar19;
  ulong uVar20;
  char *pcVar21;
  ulong uVar22;
  pointer pMVar23;
  long lVar24;
  InvalidShaderCompilerCase *pIVar25;
  float fVar26;
  undefined4 extraout_XMM0_Db;
  Shaders shaders_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_11;
  char *vertShaderSourceCStr_1;
  vector<long,_std::allocator<long>_> rangeTimes;
  ProgramContext progCtx;
  BuildInfo buildInfo;
  vector<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement>_>
  measurements;
  vector<long,_std::allocator<long>_> totalTimes;
  BuildInfo latestBuildInfo;
  vector<long,_std::allocator<long>_> fragmentCompileTimes;
  vector<long,_std::allocator<long>_> vertexCompileTimes;
  vector<long,_std::allocator<long>_> sourceSetTimes;
  ProgramContext latestProgramContext;
  string local_488;
  string local_468;
  string local_448;
  string local_428;
  TestLog *local_408;
  undefined1 local_400 [32];
  _Alloc_hider local_3e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3d0;
  vector<long,_std::allocator<long>_> local_3c0;
  undefined1 local_3a0 [32];
  _Alloc_hider local_380;
  size_type local_378;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_370;
  _Alloc_hider local_360;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_350;
  qpKeyValueTag local_340;
  float local_33c;
  string local_338;
  undefined1 local_318 [8];
  _Alloc_hider local_310;
  undefined1 local_308 [24];
  _Alloc_hider local_2f0;
  undefined1 local_2e8 [32];
  long local_2c8 [2];
  qpKeyValueTag local_2b8;
  float local_2b4;
  ios_base local_2a8 [8];
  ios_base local_2a0 [264];
  vector<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement>_>
  local_198;
  InvalidShaderCompilerCase *local_178;
  float local_16c;
  undefined8 local_168;
  vector<long,_std::allocator<long>_> local_158;
  vector<long,_std::allocator<long>_> local_140;
  undefined1 local_128 [8];
  Shaders local_120;
  undefined1 local_118 [16];
  string local_108 [8];
  _Alloc_hider local_100;
  undefined1 local_f8 [28];
  int local_dc;
  vector<long,_std::allocator<long>_> local_d8;
  vector<long,_std::allocator<long>_> local_b8;
  vector<long,_std::allocator<long>_> local_98;
  undefined1 local_78 [32];
  _Alloc_hider local_58;
  size_type local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  ulong local_38;
  
  validity = SHADER_VALIDITY_INVALID_CHAR;
  if (this->m_invalidityType != INVALIDITY_INVALID_CHAR) {
    validity = this->m_invalidityType == INVALIDITY_SEMANTIC_ERROR ^ SHADER_VALIDITY_LAST;
  }
  uVar19 = this->m_startHash ^ 0xc0a9496a;
  local_3a0._0_8_ = local_3a0 + 0x10;
  local_3a0._8_8_ = 0;
  local_3a0[0x10] = '\0';
  local_380._M_p = (pointer)&local_370;
  local_378 = 0;
  local_370._M_local_buf[0] = '\0';
  paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_128 + 0x10);
  local_78._0_4_ = 0x122;
  local_78._4_4_ = 0;
  local_178 = this;
  local_128 = (undefined1  [8])paVar13;
  paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)std::__cxx11::string::_M_create((ulong *)local_128,(ulong)local_78);
  uVar2 = local_78._0_8_;
  local_118._0_8_ = local_78._0_8_;
  local_128 = (undefined1  [8])paVar8;
  memcpy(paVar8,
         "attribute highp vec4 a_position${NAME_SPEC};\nattribute mediump vec4 a_value${NAME_SPEC};\nvarying mediump vec4 v_value${NAME_SPEC};\n\nvoid main()\n{\n\tgl_Position = a_position${NAME_SPEC} * (0.95 + 0.05*${FLOAT01});\n\tv_value${NAME_SPEC} = a_value${NAME_SPEC};\n${SEMANTIC_ERROR}}\n${INVALID_CHAR}"
         ,0x122);
  uVar3 = local_78._0_8_;
  local_78._0_4_ = (undefined4)uVar2;
  local_78._4_4_ = SUB84(uVar2,4);
  local_120.vertShader = local_78._0_4_;
  local_120.fragShader = local_78._4_4_;
  paVar8->_M_local_buf[uVar2] = '\0';
  local_78._0_8_ = uVar3;
  specializeShaderSource((string *)local_318,(string *)local_128,uVar19,validity);
  std::__cxx11::string::operator=((string *)local_3a0,(string *)local_318);
  if (local_318 != (undefined1  [8])local_308) {
    operator_delete((void *)local_318,local_308._0_8_ + 1);
  }
  if (local_128 != (undefined1  [8])paVar13) {
    operator_delete((void *)local_128,local_118._0_8_ + 1);
  }
  local_78._0_4_ = 0x8d;
  local_78._4_4_ = 0;
  local_128 = (undefined1  [8])paVar13;
  paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)std::__cxx11::string::_M_create((ulong *)local_128,(ulong)local_78);
  uVar2 = local_78._0_8_;
  local_118._0_8_ = local_78._0_8_;
  local_128 = (undefined1  [8])paVar8;
  memcpy(paVar8,
         "varying mediump vec4 v_value${NAME_SPEC};\n\nvoid main()\n{\n\tgl_FragColor = v_value${NAME_SPEC} + ${FLOAT01};\n${SEMANTIC_ERROR}}\n${INVALID_CHAR}"
         ,0x8d);
  uVar3 = local_78._0_8_;
  local_78._0_4_ = (undefined4)uVar2;
  local_78._4_4_ = SUB84(uVar2,4);
  local_120.vertShader = local_78._0_4_;
  local_120.fragShader = local_78._4_4_;
  paVar8->_M_local_buf[uVar2] = '\0';
  local_78._0_8_ = uVar3;
  specializeShaderSource((string *)local_318,(string *)local_128,uVar19,validity);
  std::__cxx11::string::operator=((string *)&local_380,(string *)local_318);
  pIVar25 = local_178;
  if (local_318 != (undefined1  [8])local_308) {
    operator_delete((void *)local_318,local_308._0_8_ + 1);
  }
  if (local_128 != (undefined1  [8])paVar13) {
    operator_delete((void *)local_128,(ulong)(local_118._0_8_ + 1));
  }
  iVar7 = (*((pIVar25->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  uVar19 = (**(code **)(CONCAT44(extraout_var,iVar7) + 0x3f0))(0x8b31);
  lVar9 = (**(code **)(CONCAT44(extraout_var,iVar7) + 0x3f0))(0x8b30);
  local_78._0_8_ = (ulong)uVar19 | lVar9 << 0x20;
  iVar7 = (*((pIVar25->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  uVar2 = local_78._0_8_;
  local_318 = (undefined1  [8])local_3a0._0_8_;
  local_128 = (undefined1  [8])local_380._M_p;
  (**(code **)(CONCAT44(extraout_var_00,iVar7) + 0x12b8))(local_78._0_8_ & 0xffffffff,1,local_318,0)
  ;
  uVar4 = local_78._4_4_;
  (**(code **)(CONCAT44(extraout_var_00,iVar7) + 0x12b8))(local_78._4_4_,1,local_128,0);
  local_310._M_p = local_308 + 8;
  local_308._0_8_ = 0;
  local_308[8] = '\0';
  local_2f0._M_p = local_2e8 + 8;
  local_2e8._0_8_ = 0;
  local_2e8[8] = '\0';
  iVar7 = (*((pIVar25->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  (**(code **)(CONCAT44(extraout_var_01,iVar7) + 0x248))(uVar2 & 0xffffffff);
  (**(code **)(CONCAT44(extraout_var_01,iVar7) + 0xa70))(uVar2 & 0xffffffff,0x8b81,local_128);
  local_318[0] = (string)(local_128._0_4_ != 0);
  iVar7 = (*((pIVar25->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  (**(code **)(CONCAT44(extraout_var_02,iVar7) + 0x248))(uVar4);
  (**(code **)(CONCAT44(extraout_var_02,iVar7) + 0xa70))(uVar4,0x8b81,local_128);
  local_318[1] = local_128._0_4_ != 0;
  if ((local_128._0_4_ != 0) || (local_318[0] != (string)0x0)) {
    getLogs((Logs *)local_128,pIVar25,(Shaders *)local_78);
    std::__cxx11::string::operator=((string *)&local_310,(string *)local_128);
    std::__cxx11::string::operator=((string *)&local_2f0,local_108);
    if (local_108 != (string  [8])local_f8) {
      operator_delete((void *)local_108,local_f8._0_8_ + 1);
    }
    if (local_128 != (undefined1  [8])paVar13) {
      operator_delete((void *)local_128,(ulong)(local_118._0_8_ + 1));
    }
    logProgramData(pIVar25,(BuildInfo *)local_318,(ProgramContext *)local_3a0);
    iVar7 = (*((pIVar25->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var_09,iVar7) + 0x470))(uVar2 & 0xffffffff);
    (**(code **)(CONCAT44(extraout_var_09,iVar7) + 0x470))(uVar4);
    tcu::TestContext::setTestResult
              ((pIVar25->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL
               ,"Compilation of a shader erroneously succeeded");
    if (local_2f0._M_p != local_2e8 + 8) {
      operator_delete(local_2f0._M_p,CONCAT71(local_2e8._9_7_,local_2e8[8]) + 1);
    }
    if (local_310._M_p != local_308 + 8) {
      operator_delete(local_310._M_p,CONCAT71(local_308._9_7_,local_308[8]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_380._M_p != &local_370) {
      operator_delete(local_380._M_p,
                      CONCAT71(local_370._M_allocated_capacity._1_7_,local_370._M_local_buf[0]) + 1)
      ;
    }
    if ((pointer)local_3a0._0_8_ == (pointer)(local_3a0 + 0x10)) {
      return STOP;
    }
    uVar20 = CONCAT71(local_3a0._17_7_,local_3a0[0x10]) + 1;
    pMVar23 = (pointer)local_3a0._0_8_;
  }
  else {
    iVar7 = (*((pIVar25->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var_03,iVar7) + 0x470))(uVar2 & 0xffffffff);
    (**(code **)(CONCAT44(extraout_var_03,iVar7) + 0x470))(uVar4);
    if (local_2f0._M_p != local_2e8 + 8) {
      operator_delete(local_2f0._M_p,CONCAT71(local_2e8._9_7_,local_2e8[8]) + 1);
    }
    if (local_310._M_p != local_308 + 8) {
      operator_delete(local_310._M_p,CONCAT71(local_308._9_7_,local_308[8]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_380._M_p != &local_370) {
      operator_delete(local_380._M_p,
                      CONCAT71(local_370._M_allocated_capacity._1_7_,local_370._M_local_buf[0]) + 1)
      ;
    }
    if ((pointer)local_3a0._0_8_ != (pointer)(local_3a0 + 0x10)) {
      operator_delete((void *)local_3a0._0_8_,CONCAT71(local_3a0._17_7_,local_3a0[0x10]) + 1);
    }
    local_198.
    super__Vector_base<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (Measurement *)0x0;
    local_198.
    super__Vector_base<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_198.
    super__Vector_base<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement>_>
    ._M_impl.super__Vector_impl_data._M_finish = (Measurement *)0x0;
    local_78._0_8_ = (long)local_78 + 0x10;
    local_78._8_8_ = 0;
    local_78[0x10] = '\0';
    local_58._M_p = (pointer)&local_48;
    local_50 = 0;
    local_48._M_local_buf[0] = '\0';
    local_120 = (Shaders)((long)local_118 + 8);
    local_118._0_8_ = (undefined1 *)0x0;
    local_118[8] = '\0';
    local_100._M_p = local_f8 + 8;
    local_f8._0_8_ = 0;
    local_f8[8] = '\0';
    while( true ) {
      bVar6 = goodEnoughMeasurements(pIVar25,&local_198);
      if (bVar6) break;
      (*(pIVar25->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])
                (local_3a0,pIVar25,
                 (ulong)(uint)((int)((ulong)((long)local_198.
                                                                                                      
                                                  super__Vector_base<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                            (long)local_198.
                                                  super__Vector_base<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                              -0x55555555));
      iVar7 = (*((pIVar25->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
      uVar19 = (**(code **)(CONCAT44(extraout_var_04,iVar7) + 0x3f0))(0x8b31);
      lVar9 = (**(code **)(CONCAT44(extraout_var_04,iVar7) + 0x3f0))(0x8b30);
      local_488._M_dataplus._M_p = (pointer)((ulong)uVar19 | lVar9 << 0x20);
      local_310._M_p = local_308 + 8;
      local_308._0_8_ = 0;
      local_308[8] = '\0';
      local_2f0._M_p = local_2e8 + 8;
      local_2e8._0_8_ = 0;
      local_2e8[8] = '\0';
      tcu::warmupCPU();
      local_168 = (code *)deGetMicroseconds();
      iVar7 = (*((pIVar25->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
      _Var1._M_p = local_488._M_dataplus._M_p;
      local_400._0_8_ = local_3a0._0_8_;
      local_468._M_dataplus._M_p = local_380._M_p;
      uVar20 = (ulong)local_488._M_dataplus._M_p & 0xffffffff;
      (**(code **)(CONCAT44(extraout_var_05,iVar7) + 0x12b8))(uVar20,1,local_400,0);
      local_408 = (TestLog *)CONCAT44(local_408._4_4_,local_488._M_dataplus._M_p._4_4_);
      (**(code **)(CONCAT44(extraout_var_05,iVar7) + 0x12b8))
                (local_488._M_dataplus._M_p._4_4_,1,&local_468,0);
      dVar10 = deGetMicroseconds();
      iVar7 = (*((pIVar25->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
      (**(code **)(CONCAT44(extraout_var_06,iVar7) + 0x248))((ulong)_Var1._M_p & 0xffffffff);
      (**(code **)(CONCAT44(extraout_var_06,iVar7) + 0xa70))(uVar20,0x8b81,local_400);
      local_318[0] = (string)(local_400._0_4_ != 0);
      dVar11 = deGetMicroseconds();
      iVar7 = (*((pIVar25->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
      (**(code **)(CONCAT44(extraout_var_07,iVar7) + 0x248))((ulong)local_408 & 0xffffffff);
      (**(code **)(CONCAT44(extraout_var_07,iVar7) + 0xa70))
                ((ulong)local_408 & 0xffffffff,0x8b81,local_400);
      local_318[1] = local_400._0_4_ != 0;
      dVar12 = deGetMicroseconds();
      pIVar25 = local_178;
      getLogs((Logs *)local_400,local_178,(Shaders *)&local_488);
      std::__cxx11::string::operator=((string *)&local_310,(string *)local_400);
      std::__cxx11::string::operator=((string *)&local_2f0,(string *)&local_3e0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3e0._M_p != &local_3d0) {
        operator_delete(local_3e0._M_p,local_3d0._M_allocated_capacity + 1);
      }
      if ((pointer)local_400._0_8_ != (pointer)(local_400 + 0x10)) {
        operator_delete((void *)local_400._0_8_,local_400._16_8_ + 1);
      }
      if ((local_318[0] != (string)0x0) || ((bool)local_318[1] == true)) {
        logProgramData(pIVar25,(BuildInfo *)local_318,(ProgramContext *)local_3a0);
        iVar7 = (*((pIVar25->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
        (**(code **)(CONCAT44(extraout_var_10,iVar7) + 0x470))((ulong)_Var1._M_p & 0xffffffff);
        (**(code **)(CONCAT44(extraout_var_10,iVar7) + 0x470))((ulong)local_408 & 0xffffffff);
        tcu::TestContext::setTestResult
                  ((pIVar25->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_FAIL,"Compilation of a shader erroneously succeeded");
        if (local_2f0._M_p != local_2e8 + 8) {
          operator_delete(local_2f0._M_p,CONCAT71(local_2e8._9_7_,local_2e8[8]) + 1);
        }
        if (local_310._M_p != local_308 + 8) {
          operator_delete(local_310._M_p,CONCAT71(local_308._9_7_,local_308[8]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_380._M_p != &local_370) {
          operator_delete(local_380._M_p,
                          CONCAT71(local_370._M_allocated_capacity._1_7_,local_370._M_local_buf[0])
                          + 1);
        }
        if ((pointer)local_3a0._0_8_ == (pointer)(local_3a0 + 0x10)) goto LAB_00450515;
        uVar20 = CONCAT71(local_3a0._17_7_,local_3a0[0x10]) + 1;
        pMVar23 = (pointer)local_3a0._0_8_;
        goto LAB_00450510;
      }
      iVar7 = (*((pIVar25->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
      (**(code **)(CONCAT44(extraout_var_08,iVar7) + 0x470))((ulong)_Var1._M_p & 0xffffffff);
      (**(code **)(CONCAT44(extraout_var_08,iVar7) + 0x470))((ulong)local_408 & 0xffffffff);
      local_400._16_8_ = dVar12 - dVar11;
      local_400._8_8_ = dVar11 - dVar10;
      local_400._0_8_ = dVar10 - (long)local_168;
      if (local_198.
          super__Vector_base<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          local_198.
          super__Vector_base<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement>_>
        ::_M_realloc_insert<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement>
                  (&local_198,
                   (iterator)
                   local_198.
                   super__Vector_base<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement>_>
                   ._M_impl.super__Vector_impl_data._M_finish,(Measurement *)local_400);
      }
      else {
        (local_198.
         super__Vector_base<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement>_>
         ._M_impl.super__Vector_impl_data._M_finish)->fragmentCompileTime = local_400._16_8_;
        (local_198.
         super__Vector_base<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement>_>
         ._M_impl.super__Vector_impl_data._M_finish)->sourceSetTime = local_400._0_8_;
        (local_198.
         super__Vector_base<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement>_>
         ._M_impl.super__Vector_impl_data._M_finish)->vertexCompileTime = local_400._8_8_;
        local_198.
        super__Vector_base<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_198.
             super__Vector_base<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement>_>
             ._M_impl.super__Vector_impl_data._M_finish + 1;
      }
      local_128._0_2_ = local_318._0_2_;
      std::__cxx11::string::_M_assign((string *)(local_128 + 8));
      std::__cxx11::string::_M_assign((string *)&local_100);
      std::__cxx11::string::_M_assign((string *)local_78);
      std::__cxx11::string::_M_assign((string *)&local_58);
      tcu::TestContext::touchWatchdog
                ((local_178->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      if (local_2f0._M_p != local_2e8 + 8) {
        operator_delete(local_2f0._M_p,CONCAT71(local_2e8._9_7_,local_2e8[8]) + 1);
      }
      pIVar25 = local_178;
      if (local_310._M_p != local_308 + 8) {
        operator_delete(local_310._M_p,CONCAT71(local_308._9_7_,local_308[8]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_380._M_p != &local_370) {
        operator_delete(local_380._M_p,
                        CONCAT71(local_370._M_allocated_capacity._1_7_,local_370._M_local_buf[0]) +
                        1);
      }
      if ((pointer)local_3a0._0_8_ != (pointer)(local_3a0 + 0x10)) {
        operator_delete((void *)local_3a0._0_8_,CONCAT71(local_3a0._17_7_,local_3a0[0x10]) + 1);
      }
    }
    local_408 = ((pIVar25->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    local_98.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (long *)0x0;
    local_98.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_98.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_finish = (long *)0x0;
    local_b8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (long *)0x0;
    local_b8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_b8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_finish = (long *)0x0;
    local_d8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (long *)0x0;
    local_d8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_d8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_finish = (long *)0x0;
    local_158.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (long *)0x0;
    local_158.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_158.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_finish = (long *)0x0;
    local_3a0._0_8_ = local_3a0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3a0,"IterationMeasurements","");
    local_400._0_8_ = local_400 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_400,"Iteration measurements of compilation times","");
    tcu::LogSection::LogSection((LogSection *)local_318,(string *)local_3a0,(string *)local_400);
    tcu::TestLog::startSection(local_408,(char *)local_318,(char *)local_308._16_8_);
    if ((undefined1 *)local_308._16_8_ != local_2e8) {
      operator_delete((void *)local_308._16_8_,local_2e8._0_8_ + 1);
    }
    if (local_318 != (undefined1  [8])local_308) {
      operator_delete((void *)local_318,local_308._0_8_ + 1);
    }
    if ((pointer)local_400._0_8_ != (pointer)(local_400 + 0x10)) {
      operator_delete((void *)local_400._0_8_,local_400._16_8_ + 1);
    }
    if ((undefined1 *)local_3a0._0_8_ != local_3a0 + 0x10) {
      operator_delete((void *)local_3a0._0_8_,CONCAT71(local_3a0._17_7_,local_3a0[0x10]) + 1);
    }
    if (0 < (int)((ulong)((long)local_198.
                                super__Vector_base<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)local_198.
                               super__Vector_base<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555) {
      lVar24 = 0x10;
      lVar9 = 0;
      do {
        plVar16 = (long *)((long)local_198.
                                 super__Vector_base<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement>_>
                                 ._M_impl.super__Vector_impl_data._M_start + lVar24 + -0x10);
        if (local_98.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
            ._M_finish ==
            local_98.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
            ._M_end_of_storage) {
          std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
                    ((vector<long,std::allocator<long>> *)&local_98,
                     (iterator)
                     local_98.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                     super__Vector_impl_data._M_finish,plVar16);
        }
        else {
          *local_98.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
           _M_finish = *plVar16;
          local_98.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_finish = local_98.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_finish + 1;
        }
        plVar16 = (long *)((long)local_198.
                                 super__Vector_base<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement>_>
                                 ._M_impl.super__Vector_impl_data._M_start + lVar24 + -8);
        if (local_b8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
            ._M_finish ==
            local_b8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
            ._M_end_of_storage) {
          std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
                    ((vector<long,std::allocator<long>> *)&local_b8,
                     (iterator)
                     local_b8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                     super__Vector_impl_data._M_finish,plVar16);
        }
        else {
          *local_b8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
           _M_finish = *plVar16;
          local_b8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_finish = local_b8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_finish + 1;
        }
        plVar16 = (long *)((long)&(local_198.
                                   super__Vector_base<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->sourceSetTime +
                          lVar24);
        if (local_d8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
            ._M_finish ==
            local_d8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
            ._M_end_of_storage) {
          std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
                    ((vector<long,std::allocator<long>> *)&local_d8,
                     (iterator)
                     local_d8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                     super__Vector_impl_data._M_finish,plVar16);
        }
        else {
          *local_d8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
           _M_finish = *plVar16;
          local_d8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_finish = local_d8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_finish + 1;
        }
        local_318 = (undefined1  [8])
                    (*(long *)((long)local_198.
                                     super__Vector_base<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement>_>
                                     ._M_impl.super__Vector_impl_data._M_start + lVar24 + -8) +
                     *(long *)((long)local_198.
                                     super__Vector_base<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement>_>
                                     ._M_impl.super__Vector_impl_data._M_start + lVar24 + -0x10) +
                    *(long *)((long)&(local_198.
                                      super__Vector_base<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->sourceSetTime +
                             lVar24));
        if (local_158.super__Vector_base<long,_std::allocator<long>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_158.super__Vector_base<long,_std::allocator<long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
                    (&local_158,
                     (iterator)
                     local_158.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                     super__Vector_impl_data._M_finish,(long *)local_318);
        }
        else {
          *local_158.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
           ._M_finish = (long)local_318;
          local_158.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_finish = local_158.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_finish + 1;
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_318);
        std::ostream::operator<<((string *)local_318,(int)lVar9);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_318);
        std::ios_base::~ios_base(local_2a8);
        plVar16 = (long *)std::__cxx11::string::replace((ulong)&local_488,0,(char *)0x0,0x6750cf);
        local_468._M_dataplus._M_p = (pointer)&local_468.field_2;
        paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(plVar16 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar16 == paVar13) {
          local_468.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
          local_468.field_2._8_8_ = plVar16[3];
        }
        else {
          local_468.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
          local_468._M_dataplus._M_p = (pointer)*plVar16;
        }
        local_468._M_string_length = plVar16[1];
        *plVar16 = (long)paVar13;
        plVar16[1] = 0;
        *(undefined1 *)(plVar16 + 2) = 0;
        plVar16 = (long *)std::__cxx11::string::append((char *)&local_468);
        local_400._0_8_ = local_400 + 0x10;
        pMVar23 = (pointer)(plVar16 + 2);
        if ((pointer)*plVar16 == pMVar23) {
          local_400._16_8_ = pMVar23->sourceSetTime;
          local_400._24_8_ = plVar16[3];
        }
        else {
          local_400._16_8_ = pMVar23->sourceSetTime;
          local_400._0_8_ = (pointer)*plVar16;
        }
        local_400._8_8_ = plVar16[1];
        *plVar16 = (long)pMVar23;
        plVar16[1] = 0;
        *(undefined1 *)(plVar16 + 2) = 0;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_318);
        std::ostream::operator<<((string *)local_318,(int)lVar9);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_318);
        std::ios_base::~ios_base(local_2a8);
        plVar16 = (long *)std::__cxx11::string::replace((ulong)&local_3c0,0,(char *)0x0,0x6750eb);
        local_448._M_dataplus._M_p = (pointer)&local_448.field_2;
        psVar14 = (size_type *)(plVar16 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar16 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar14) {
          local_448.field_2._M_allocated_capacity = *psVar14;
          local_448.field_2._8_8_ = plVar16[3];
        }
        else {
          local_448.field_2._M_allocated_capacity = *psVar14;
          local_448._M_dataplus._M_p = (pointer)*plVar16;
        }
        local_448._M_string_length = plVar16[1];
        *plVar16 = (long)psVar14;
        plVar16[1] = 0;
        *(undefined1 *)(plVar16 + 2) = 0;
        plVar16 = (long *)std::__cxx11::string::append((char *)&local_448);
        psVar14 = (size_type *)(plVar16 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar16 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar14) {
          local_428.field_2._M_allocated_capacity = *psVar14;
          local_428.field_2._8_4_ = (undefined4)plVar16[3];
          local_428.field_2._12_4_ = *(undefined4 *)((long)plVar16 + 0x1c);
          local_428._M_dataplus._M_p = (pointer)&local_428.field_2;
        }
        else {
          local_428.field_2._M_allocated_capacity = *psVar14;
          local_428._M_dataplus._M_p = (pointer)*plVar16;
        }
        local_428._M_string_length = plVar16[1];
        *plVar16 = (long)psVar14;
        plVar16[1] = 0;
        *(undefined1 *)(plVar16 + 2) = 0;
        local_318 = (undefined1  [8])local_308;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_318,"ms","");
        tcu::LogNumber<float>::LogNumber
                  ((LogNumber<float> *)local_3a0,(string *)local_400,&local_428,(string *)local_318,
                   QP_KEY_TAG_TIME,
                   (float)(*(long *)((long)local_198.
                                           super__Vector_base<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement>_>
                                           ._M_impl.super__Vector_impl_data._M_start + lVar24 + -8)
                           + *(long *)((long)local_198.
                                             super__Vector_base<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement>_>
                                             ._M_impl.super__Vector_impl_data._M_start +
                                      lVar24 + -0x10) +
                          *(long *)((long)&(local_198.
                                            super__Vector_base<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->
                                           sourceSetTime + lVar24)) / 1000.0);
        tcu::TestLog::writeFloat
                  (local_408,(char *)local_3a0._0_8_,local_380._M_p,local_360._M_p,local_340,
                   local_33c);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_360._M_p != &local_350) {
          operator_delete(local_360._M_p,local_350._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_380._M_p != &local_370) {
          operator_delete(local_380._M_p,
                          CONCAT71(local_370._M_allocated_capacity._1_7_,local_370._M_local_buf[0])
                          + 1);
        }
        if ((undefined1 *)local_3a0._0_8_ != local_3a0 + 0x10) {
          operator_delete((void *)local_3a0._0_8_,CONCAT71(local_3a0._17_7_,local_3a0[0x10]) + 1);
        }
        if (local_318 != (undefined1  [8])local_308) {
          operator_delete((void *)local_318,local_308._0_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_428._M_dataplus._M_p != &local_428.field_2) {
          operator_delete(local_428._M_dataplus._M_p,local_428.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_448._M_dataplus._M_p != &local_448.field_2) {
          operator_delete(local_448._M_dataplus._M_p,local_448.field_2._M_allocated_capacity + 1);
        }
        if ((pointer *)
            local_3c0.super__Vector_base<long,_std::allocator<long>_>._M_impl.
            super__Vector_impl_data._M_start !=
            &local_3c0.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage) {
          operator_delete(local_3c0.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_3c0.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage + 1);
        }
        if ((pointer)local_400._0_8_ != (pointer)(local_400 + 0x10)) {
          operator_delete((void *)local_400._0_8_,local_400._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_468._M_dataplus._M_p != &local_468.field_2) {
          operator_delete(local_468._M_dataplus._M_p,local_468.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_488._M_dataplus._M_p != &local_488.field_2) {
          operator_delete(local_488._M_dataplus._M_p,local_488.field_2._M_allocated_capacity + 1);
        }
        lVar9 = lVar9 + 1;
        lVar24 = lVar24 + 0x18;
      } while (lVar9 < (int)((ulong)((long)local_198.
                                           super__Vector_base<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)local_198.
                                          super__Vector_base<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement>_>
                                          ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                       -0x55555555);
    }
    iVar7 = 0;
    do {
      pcVar21 = "LowestHalf";
      if (iVar7 == 0) {
        pcVar21 = "";
      }
      local_3a0._0_8_ = local_3a0 + 0x10;
      pcVar18 = pcVar21 + 10;
      if (iVar7 == 0) {
        pcVar18 = pcVar21;
      }
      std::__cxx11::string::_M_construct<char_const*>((string *)local_3a0,pcVar21,pcVar18);
      if (iVar7 == 0) {
        std::vector<long,_std::allocator<long>_>::vector(&local_3c0,&local_158);
      }
      else {
        vectorLowestPercentage<long>(&local_3c0,&local_158,0.5);
      }
      local_318 = (undefined1  [8])local_408;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_310);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_310,"\nStatistics computed from ",0x1a);
      pcVar21 = "only the lowest 50%";
      if (iVar7 == 0) {
        pcVar21 = "all";
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_310,pcVar21,(ulong)(iVar7 != 0) << 4 | 3);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_310," of the above measurements:",0x1b);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_318,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_310);
      std::ios_base::~ios_base(local_2a0);
      local_468._M_dataplus._M_p = (pointer)&local_468.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_468,local_3a0._0_8_,(pointer)(local_3a0._0_8_ + local_3a0._8_8_));
      std::__cxx11::string::append((char *)&local_468);
      plVar16 = (long *)std::__cxx11::string::append((char *)&local_468);
      local_400._0_8_ = local_400 + 0x10;
      psVar14 = (size_type *)(plVar16 + 2);
      if ((size_type *)*plVar16 == psVar14) {
        local_400._16_8_ = *psVar14;
        local_400._24_8_ = plVar16[3];
      }
      else {
        local_400._16_8_ = *psVar14;
        local_400._0_8_ = (size_type *)*plVar16;
      }
      local_400._8_8_ = plVar16[1];
      *plVar16 = (long)psVar14;
      plVar16[1] = 0;
      *(undefined1 *)(plVar16 + 2) = 0;
      local_428._M_dataplus._M_p = (pointer)&local_428.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_428," of total time","");
      plVar16 = (long *)std::__cxx11::string::replace((ulong)&local_428,0,(char *)0x0,0x675161);
      local_488._M_dataplus._M_p = (pointer)&local_488.field_2;
      psVar14 = (size_type *)(plVar16 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar16 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar14) {
        local_488.field_2._M_allocated_capacity = *psVar14;
        local_488.field_2._8_4_ = (undefined4)plVar16[3];
        local_488.field_2._12_4_ = *(undefined4 *)((long)(plVar16 + 3) + 4);
      }
      else {
        local_488.field_2._M_allocated_capacity = *psVar14;
        local_488._M_dataplus._M_p = (pointer)*plVar16;
      }
      local_488._M_string_length = plVar16[1];
      *plVar16 = (long)psVar14;
      plVar16[1] = 0;
      *(undefined1 *)(plVar16 + 2) = 0;
      local_448._M_dataplus._M_p = (pointer)&local_448.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_448,"ms","");
      fVar26 = vectorFloatMedian<long>(&local_3c0);
      tcu::LogNumber<float>::LogNumber
                ((LogNumber<float> *)local_318,(string *)local_400,&local_488,&local_448,
                 QP_KEY_TAG_TIME,fVar26 / 1000.0);
      tcu::TestLog::writeFloat
                (local_408,(char *)local_318,(char *)local_308._16_8_,(char *)local_2e8._16_8_,
                 local_2b8,local_2b4);
      if ((long *)local_2e8._16_8_ != local_2c8) {
        operator_delete((void *)local_2e8._16_8_,local_2c8[0] + 1);
      }
      if ((undefined1 *)local_308._16_8_ != local_2e8) {
        operator_delete((void *)local_308._16_8_,local_2e8._0_8_ + 1);
      }
      if (local_318 != (undefined1  [8])local_308) {
        operator_delete((void *)local_318,local_308._0_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_448._M_dataplus._M_p != &local_448.field_2) {
        operator_delete(local_448._M_dataplus._M_p,local_448.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_488._M_dataplus._M_p != &local_488.field_2) {
        operator_delete(local_488._M_dataplus._M_p,local_488.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_428._M_dataplus._M_p != &local_428.field_2) {
        operator_delete(local_428._M_dataplus._M_p,local_428.field_2._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_400._0_8_ != local_400 + 0x10) {
        operator_delete((void *)local_400._0_8_,local_400._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_468._M_dataplus._M_p != &local_468.field_2) {
        operator_delete(local_468._M_dataplus._M_p,local_468.field_2._M_allocated_capacity + 1);
      }
      local_468._M_dataplus._M_p = (pointer)&local_468.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_468,local_3a0._0_8_,(pointer)(local_3a0._0_8_ + local_3a0._8_8_));
      std::__cxx11::string::append((char *)&local_468);
      plVar16 = (long *)std::__cxx11::string::append((char *)&local_468);
      local_400._0_8_ = local_400 + 0x10;
      psVar14 = (size_type *)(plVar16 + 2);
      if ((size_type *)*plVar16 == psVar14) {
        local_400._16_8_ = *psVar14;
        local_400._24_8_ = plVar16[3];
      }
      else {
        local_400._16_8_ = *psVar14;
        local_400._0_8_ = (size_type *)*plVar16;
      }
      local_400._8_8_ = plVar16[1];
      *plVar16 = (long)psVar14;
      plVar16[1] = 0;
      *(undefined1 *)(plVar16 + 2) = 0;
      local_428._M_dataplus._M_p = (pointer)&local_428.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_428," of total time","");
      plVar16 = (long *)std::__cxx11::string::replace((ulong)&local_428,0,(char *)0x0,0x675195);
      local_488._M_dataplus._M_p = (pointer)&local_488.field_2;
      psVar14 = (size_type *)(plVar16 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar16 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar14) {
        local_488.field_2._M_allocated_capacity = *psVar14;
        local_488.field_2._8_4_ = (undefined4)plVar16[3];
        local_488.field_2._12_4_ = *(undefined4 *)((long)(plVar16 + 3) + 4);
      }
      else {
        local_488.field_2._M_allocated_capacity = *psVar14;
        local_488._M_dataplus._M_p = (pointer)*plVar16;
      }
      local_488._M_string_length = plVar16[1];
      *plVar16 = (long)psVar14;
      plVar16[1] = 0;
      *(undefined1 *)(plVar16 + 2) = 0;
      local_448._M_dataplus._M_p = (pointer)&local_448.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_448,"ms","");
      uVar20 = (long)local_3c0.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_3c0.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3;
      uVar19 = (uint)uVar20;
      if ((int)uVar19 < 1) {
        fVar26 = 0.0;
      }
      else {
        fVar26 = 0.0;
        uVar22 = 0;
        do {
          fVar26 = fVar26 + (float)(long)local_3c0.super__Vector_base<long,_std::allocator<long>_>.
                                         _M_impl.super__Vector_impl_data._M_start[uVar22];
          uVar22 = uVar22 + 1;
        } while ((uVar19 & 0x7fffffff) != uVar22);
      }
      tcu::LogNumber<float>::LogNumber
                ((LogNumber<float> *)local_318,(string *)local_400,&local_488,&local_448,
                 QP_KEY_TAG_TIME,(fVar26 / (float)uVar20) / 1000.0);
      tcu::TestLog::writeFloat
                (local_408,(char *)local_318,(char *)local_308._16_8_,(char *)local_2e8._16_8_,
                 local_2b8,local_2b4);
      if ((long *)local_2e8._16_8_ != local_2c8) {
        operator_delete((void *)local_2e8._16_8_,local_2c8[0] + 1);
      }
      if ((undefined1 *)local_308._16_8_ != local_2e8) {
        operator_delete((void *)local_308._16_8_,local_2e8._0_8_ + 1);
      }
      if (local_318 != (undefined1  [8])local_308) {
        operator_delete((void *)local_318,local_308._0_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_448._M_dataplus._M_p != &local_448.field_2) {
        operator_delete(local_448._M_dataplus._M_p,local_448.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_488._M_dataplus._M_p != &local_488.field_2) {
        operator_delete(local_488._M_dataplus._M_p,local_488.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_428._M_dataplus._M_p != &local_428.field_2) {
        operator_delete(local_428._M_dataplus._M_p,local_428.field_2._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_400._0_8_ != local_400 + 0x10) {
        operator_delete((void *)local_400._0_8_,local_400._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_468._M_dataplus._M_p != &local_468.field_2) {
        operator_delete(local_468._M_dataplus._M_p,local_468.field_2._M_allocated_capacity + 1);
      }
      local_468._M_dataplus._M_p = (pointer)&local_468.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_468,local_3a0._0_8_,(pointer)(local_3a0._0_8_ + local_3a0._8_8_));
      std::__cxx11::string::append((char *)&local_468);
      plVar16 = (long *)std::__cxx11::string::append((char *)&local_468);
      local_400._0_8_ = local_400 + 0x10;
      psVar14 = (size_type *)(plVar16 + 2);
      if ((size_type *)*plVar16 == psVar14) {
        local_400._16_8_ = *psVar14;
        local_400._24_8_ = plVar16[3];
      }
      else {
        local_400._16_8_ = *psVar14;
        local_400._0_8_ = (size_type *)*plVar16;
      }
      local_400._8_8_ = plVar16[1];
      *plVar16 = (long)psVar14;
      plVar16[1] = 0;
      *(undefined1 *)(plVar16 + 2) = 0;
      local_428._M_dataplus._M_p = (pointer)&local_428.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_428," of total time","");
      plVar16 = (long *)std::__cxx11::string::replace((ulong)&local_428,0,(char *)0x0,0x67519d);
      local_488._M_dataplus._M_p = (pointer)&local_488.field_2;
      psVar14 = (size_type *)(plVar16 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar16 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar14) {
        local_488.field_2._M_allocated_capacity = *psVar14;
        local_488.field_2._8_4_ = (undefined4)plVar16[3];
        local_488.field_2._12_4_ = *(undefined4 *)((long)(plVar16 + 3) + 4);
      }
      else {
        local_488.field_2._M_allocated_capacity = *psVar14;
        local_488._M_dataplus._M_p = (pointer)*plVar16;
      }
      local_488._M_string_length = plVar16[1];
      *plVar16 = (long)psVar14;
      plVar16[1] = 0;
      *(undefined1 *)(plVar16 + 2) = 0;
      local_448._M_dataplus._M_p = (pointer)&local_448.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_448,"ms","");
      pplVar15 = (pointer *)
                 (local_3c0.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                  super__Vector_impl_data._M_start + 1);
      pplVar17 = (pointer *)
                 local_3c0.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                 super__Vector_impl_data._M_start;
      if (pplVar15 !=
          (pointer *)
          local_3c0.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_finish &&
          local_3c0.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_start !=
          local_3c0.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_finish) {
        do {
          pplVar5 = pplVar15;
          if ((long)*pplVar17 <= (long)*pplVar15) {
            pplVar5 = pplVar17;
          }
          pplVar17 = pplVar5;
          pplVar15 = pplVar15 + 1;
        } while (pplVar15 !=
                 (pointer *)
                 local_3c0.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      }
      tcu::LogNumber<float>::LogNumber
                ((LogNumber<float> *)local_318,(string *)local_400,&local_488,&local_448,
                 QP_KEY_TAG_TIME,(float)(long)*pplVar17 / 1000.0);
      tcu::TestLog::writeFloat
                (local_408,(char *)local_318,(char *)local_308._16_8_,(char *)local_2e8._16_8_,
                 local_2b8,local_2b4);
      if ((long *)local_2e8._16_8_ != local_2c8) {
        operator_delete((void *)local_2e8._16_8_,local_2c8[0] + 1);
      }
      if ((undefined1 *)local_308._16_8_ != local_2e8) {
        operator_delete((void *)local_308._16_8_,local_2e8._0_8_ + 1);
      }
      if (local_318 != (undefined1  [8])local_308) {
        operator_delete((void *)local_318,local_308._0_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_448._M_dataplus._M_p != &local_448.field_2) {
        operator_delete(local_448._M_dataplus._M_p,local_448.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_488._M_dataplus._M_p != &local_488.field_2) {
        operator_delete(local_488._M_dataplus._M_p,local_488.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_428._M_dataplus._M_p != &local_428.field_2) {
        operator_delete(local_428._M_dataplus._M_p,local_428.field_2._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_400._0_8_ != local_400 + 0x10) {
        operator_delete((void *)local_400._0_8_,local_400._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_468._M_dataplus._M_p != &local_468.field_2) {
        operator_delete(local_468._M_dataplus._M_p,local_468.field_2._M_allocated_capacity + 1);
      }
      local_468._M_dataplus._M_p = (pointer)&local_468.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_468,local_3a0._0_8_,(pointer)(local_3a0._0_8_ + local_3a0._8_8_));
      std::__cxx11::string::append((char *)&local_468);
      plVar16 = (long *)std::__cxx11::string::append((char *)&local_468);
      local_400._0_8_ = local_400 + 0x10;
      psVar14 = (size_type *)(plVar16 + 2);
      if ((size_type *)*plVar16 == psVar14) {
        local_400._16_8_ = *psVar14;
        local_400._24_8_ = plVar16[3];
      }
      else {
        local_400._16_8_ = *psVar14;
        local_400._0_8_ = (size_type *)*plVar16;
      }
      local_400._8_8_ = plVar16[1];
      *plVar16 = (long)psVar14;
      plVar16[1] = 0;
      *(undefined1 *)(plVar16 + 2) = 0;
      local_428._M_dataplus._M_p = (pointer)&local_428.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_428," of total time","");
      plVar16 = (long *)std::__cxx11::string::replace((ulong)&local_428,0,(char *)0x0,0x6751a5);
      local_488._M_dataplus._M_p = (pointer)&local_488.field_2;
      psVar14 = (size_type *)(plVar16 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar16 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar14) {
        local_488.field_2._M_allocated_capacity = *psVar14;
        local_488.field_2._8_4_ = (undefined4)plVar16[3];
        local_488.field_2._12_4_ = *(undefined4 *)((long)(plVar16 + 3) + 4);
      }
      else {
        local_488.field_2._M_allocated_capacity = *psVar14;
        local_488._M_dataplus._M_p = (pointer)*plVar16;
      }
      local_488._M_string_length = plVar16[1];
      *plVar16 = (long)psVar14;
      plVar16[1] = 0;
      *(undefined1 *)(plVar16 + 2) = 0;
      local_448._M_dataplus._M_p = (pointer)&local_448.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_448,"ms","");
      pplVar15 = (pointer *)
                 (local_3c0.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                  super__Vector_impl_data._M_start + 1);
      pplVar17 = (pointer *)
                 local_3c0.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                 super__Vector_impl_data._M_start;
      if (pplVar15 !=
          (pointer *)
          local_3c0.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_finish &&
          local_3c0.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_start !=
          local_3c0.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_finish) {
        do {
          pplVar5 = pplVar15;
          if ((long)*pplVar15 <= (long)*pplVar17) {
            pplVar5 = pplVar17;
          }
          pplVar17 = pplVar5;
          pplVar15 = pplVar15 + 1;
        } while (pplVar15 !=
                 (pointer *)
                 local_3c0.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      }
      tcu::LogNumber<float>::LogNumber
                ((LogNumber<float> *)local_318,(string *)local_400,&local_488,&local_448,
                 QP_KEY_TAG_TIME,(float)(long)*pplVar17 / 1000.0);
      tcu::TestLog::writeFloat
                (local_408,(char *)local_318,(char *)local_308._16_8_,(char *)local_2e8._16_8_,
                 local_2b8,local_2b4);
      if ((long *)local_2e8._16_8_ != local_2c8) {
        operator_delete((void *)local_2e8._16_8_,local_2c8[0] + 1);
      }
      if ((undefined1 *)local_308._16_8_ != local_2e8) {
        operator_delete((void *)local_308._16_8_,local_2e8._0_8_ + 1);
      }
      if (local_318 != (undefined1  [8])local_308) {
        operator_delete((void *)local_318,local_308._0_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_448._M_dataplus._M_p != &local_448.field_2) {
        operator_delete(local_448._M_dataplus._M_p,local_448.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_488._M_dataplus._M_p != &local_488.field_2) {
        operator_delete(local_488._M_dataplus._M_p,local_488.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_428._M_dataplus._M_p != &local_428.field_2) {
        operator_delete(local_428._M_dataplus._M_p,local_428.field_2._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_400._0_8_ != local_400 + 0x10) {
        operator_delete((void *)local_400._0_8_,local_400._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_468._M_dataplus._M_p != &local_468.field_2) {
        operator_delete(local_468._M_dataplus._M_p,local_468.field_2._M_allocated_capacity + 1);
      }
      local_468._M_dataplus._M_p = (pointer)&local_468.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_468,local_3a0._0_8_,(pointer)(local_3a0._0_8_ + local_3a0._8_8_));
      std::__cxx11::string::append((char *)&local_468);
      plVar16 = (long *)std::__cxx11::string::append((char *)&local_468);
      local_400._0_8_ = local_400 + 0x10;
      psVar14 = (size_type *)(plVar16 + 2);
      if ((size_type *)*plVar16 == psVar14) {
        local_400._16_8_ = *psVar14;
        local_400._24_8_ = plVar16[3];
      }
      else {
        local_400._16_8_ = *psVar14;
        local_400._0_8_ = (size_type *)*plVar16;
      }
      local_400._8_8_ = plVar16[1];
      *plVar16 = (long)psVar14;
      plVar16[1] = 0;
      *(undefined1 *)(plVar16 + 2) = 0;
      local_428._M_dataplus._M_p = (pointer)&local_428.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_428," of total time","");
      plVar16 = (long *)std::__cxx11::string::replace((ulong)&local_428,0,(char *)0x0,0x6751ad);
      local_488._M_dataplus._M_p = (pointer)&local_488.field_2;
      psVar14 = (size_type *)(plVar16 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar16 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar14) {
        local_488.field_2._M_allocated_capacity = *psVar14;
        local_488.field_2._8_4_ = (undefined4)plVar16[3];
        local_488.field_2._12_4_ = *(undefined4 *)((long)(plVar16 + 3) + 4);
      }
      else {
        local_488.field_2._M_allocated_capacity = *psVar14;
        local_488._M_dataplus._M_p = (pointer)*plVar16;
      }
      local_488._M_string_length = plVar16[1];
      *plVar16 = (long)psVar14;
      plVar16[1] = 0;
      *(undefined1 *)(plVar16 + 2) = 0;
      local_448._M_dataplus._M_p = (pointer)&local_448.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_448,"ms","");
      fVar26 = vectorFloatMedianAbsoluteDeviation<long>(&local_3c0);
      tcu::LogNumber<float>::LogNumber
                ((LogNumber<float> *)local_318,(string *)local_400,&local_488,&local_448,
                 QP_KEY_TAG_TIME,fVar26 / 1000.0);
      tcu::TestLog::writeFloat
                (local_408,(char *)local_318,(char *)local_308._16_8_,(char *)local_2e8._16_8_,
                 local_2b8,local_2b4);
      if ((long *)local_2e8._16_8_ != local_2c8) {
        operator_delete((void *)local_2e8._16_8_,local_2c8[0] + 1);
      }
      if ((undefined1 *)local_308._16_8_ != local_2e8) {
        operator_delete((void *)local_308._16_8_,local_2e8._0_8_ + 1);
      }
      if (local_318 != (undefined1  [8])local_308) {
        operator_delete((void *)local_318,local_308._0_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_448._M_dataplus._M_p != &local_448.field_2) {
        operator_delete(local_448._M_dataplus._M_p,local_448.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_488._M_dataplus._M_p != &local_488.field_2) {
        operator_delete(local_488._M_dataplus._M_p,local_488.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_428._M_dataplus._M_p != &local_428.field_2) {
        operator_delete(local_428._M_dataplus._M_p,local_428.field_2._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_400._0_8_ != local_400 + 0x10) {
        operator_delete((void *)local_400._0_8_,local_400._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_468._M_dataplus._M_p != &local_468.field_2) {
        operator_delete(local_468._M_dataplus._M_p,local_468.field_2._M_allocated_capacity + 1);
      }
      local_468._M_dataplus._M_p = (pointer)&local_468.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_468,local_3a0._0_8_,(pointer)(local_3a0._0_8_ + local_3a0._8_8_));
      std::__cxx11::string::append((char *)&local_468);
      plVar16 = (long *)std::__cxx11::string::append((char *)&local_468);
      local_400._0_8_ = local_400 + 0x10;
      psVar14 = (size_type *)(plVar16 + 2);
      if ((size_type *)*plVar16 == psVar14) {
        local_400._16_8_ = *psVar14;
        local_400._24_8_ = plVar16[3];
      }
      else {
        local_400._16_8_ = *psVar14;
        local_400._0_8_ = (size_type *)*plVar16;
      }
      local_400._8_8_ = plVar16[1];
      *plVar16 = (long)psVar14;
      plVar16[1] = 0;
      *(undefined1 *)(plVar16 + 2) = 0;
      local_428._M_dataplus._M_p = (pointer)&local_428.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_428," of total time","");
      plVar16 = (long *)std::__cxx11::string::replace((ulong)&local_428,0,(char *)0x0,0x6751e7);
      local_488._M_dataplus._M_p = (pointer)&local_488.field_2;
      psVar14 = (size_type *)(plVar16 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar16 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar14) {
        local_488.field_2._M_allocated_capacity = *psVar14;
        local_488.field_2._8_4_ = (undefined4)plVar16[3];
        local_488.field_2._12_4_ = *(undefined4 *)((long)(plVar16 + 3) + 4);
      }
      else {
        local_488.field_2._M_allocated_capacity = *psVar14;
        local_488._M_dataplus._M_p = (pointer)*plVar16;
      }
      local_488._M_string_length = plVar16[1];
      *plVar16 = (long)psVar14;
      plVar16[1] = 0;
      *(undefined1 *)(plVar16 + 2) = 0;
      local_448._M_dataplus._M_p = (pointer)&local_448.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_448,"");
      fVar26 = vectorFloatMedianAbsoluteDeviation<long>(&local_3c0);
      local_168 = (code *)CONCAT44(extraout_XMM0_Db,fVar26);
      fVar26 = vectorFloatMedian<long>(&local_3c0);
      tcu::LogNumber<float>::LogNumber
                ((LogNumber<float> *)local_318,(string *)local_400,&local_488,&local_448,
                 QP_KEY_TAG_NONE,
                 (float)(~-(uint)(fVar26 == 0.0) & (uint)((float)local_168 / fVar26)));
      tcu::TestLog::writeFloat
                (local_408,(char *)local_318,(char *)local_308._16_8_,(char *)local_2e8._16_8_,
                 local_2b8,local_2b4);
      if ((long *)local_2e8._16_8_ != local_2c8) {
        operator_delete((void *)local_2e8._16_8_,local_2c8[0] + 1);
      }
      if ((undefined1 *)local_308._16_8_ != local_2e8) {
        operator_delete((void *)local_308._16_8_,local_2e8._0_8_ + 1);
      }
      if (local_318 != (undefined1  [8])local_308) {
        operator_delete((void *)local_318,local_308._0_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_448._M_dataplus._M_p != &local_448.field_2) {
        operator_delete(local_448._M_dataplus._M_p,local_448.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_488._M_dataplus._M_p != &local_488.field_2) {
        operator_delete(local_488._M_dataplus._M_p,local_488.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_428._M_dataplus._M_p != &local_428.field_2) {
        operator_delete(local_428._M_dataplus._M_p,local_428.field_2._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_400._0_8_ != local_400 + 0x10) {
        operator_delete((void *)local_400._0_8_,local_400._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_468._M_dataplus._M_p != &local_468.field_2) {
        operator_delete(local_468._M_dataplus._M_p,local_468.field_2._M_allocated_capacity + 1);
      }
      local_468._M_dataplus._M_p = (pointer)&local_468.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_468,local_3a0._0_8_,(pointer)(local_3a0._0_8_ + local_3a0._8_8_));
      std::__cxx11::string::append((char *)&local_468);
      plVar16 = (long *)std::__cxx11::string::append((char *)&local_468);
      local_400._0_8_ = local_400 + 0x10;
      psVar14 = (size_type *)(plVar16 + 2);
      if ((size_type *)*plVar16 == psVar14) {
        local_400._16_8_ = *psVar14;
        local_400._24_8_ = plVar16[3];
      }
      else {
        local_400._16_8_ = *psVar14;
        local_400._0_8_ = (size_type *)*plVar16;
      }
      local_400._8_8_ = plVar16[1];
      *plVar16 = (long)psVar14;
      plVar16[1] = 0;
      *(undefined1 *)(plVar16 + 2) = 0;
      local_428._M_dataplus._M_p = (pointer)&local_428.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_428," of total time","");
      plVar16 = (long *)std::__cxx11::string::replace((ulong)&local_428,0,(char *)0x0,0x67520a);
      local_488._M_dataplus._M_p = (pointer)&local_488.field_2;
      psVar14 = (size_type *)(plVar16 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar16 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar14) {
        local_488.field_2._M_allocated_capacity = *psVar14;
        local_488.field_2._8_4_ = (undefined4)plVar16[3];
        local_488.field_2._12_4_ = *(undefined4 *)((long)(plVar16 + 3) + 4);
      }
      else {
        local_488.field_2._M_allocated_capacity = *psVar14;
        local_488._M_dataplus._M_p = (pointer)*plVar16;
      }
      local_488._M_string_length = plVar16[1];
      *plVar16 = (long)psVar14;
      plVar16[1] = 0;
      *(undefined1 *)(plVar16 + 2) = 0;
      local_448._M_dataplus._M_p = (pointer)&local_448.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_448,"ms","");
      fVar26 = vectorFloatStandardDeviation<long>(&local_3c0);
      tcu::LogNumber<float>::LogNumber
                ((LogNumber<float> *)local_318,(string *)local_400,&local_488,&local_448,
                 QP_KEY_TAG_TIME,fVar26 / 1000.0);
      tcu::TestLog::writeFloat
                (local_408,(char *)local_318,(char *)local_308._16_8_,(char *)local_2e8._16_8_,
                 local_2b8,local_2b4);
      if ((long *)local_2e8._16_8_ != local_2c8) {
        operator_delete((void *)local_2e8._16_8_,local_2c8[0] + 1);
      }
      if ((undefined1 *)local_308._16_8_ != local_2e8) {
        operator_delete((void *)local_308._16_8_,local_2e8._0_8_ + 1);
      }
      if (local_318 != (undefined1  [8])local_308) {
        operator_delete((void *)local_318,local_308._0_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_448._M_dataplus._M_p != &local_448.field_2) {
        operator_delete(local_448._M_dataplus._M_p,local_448.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_488._M_dataplus._M_p != &local_488.field_2) {
        operator_delete(local_488._M_dataplus._M_p,local_488.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_428._M_dataplus._M_p != &local_428.field_2) {
        operator_delete(local_428._M_dataplus._M_p,local_428.field_2._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_400._0_8_ != local_400 + 0x10) {
        operator_delete((void *)local_400._0_8_,local_400._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_468._M_dataplus._M_p != &local_468.field_2) {
        operator_delete(local_468._M_dataplus._M_p,local_468.field_2._M_allocated_capacity + 1);
      }
      local_468._M_dataplus._M_p = (pointer)&local_468.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_468,local_3a0._0_8_,(pointer)(local_3a0._0_8_ + local_3a0._8_8_));
      std::__cxx11::string::append((char *)&local_468);
      plVar16 = (long *)std::__cxx11::string::append((char *)&local_468);
      local_400._0_8_ = local_400 + 0x10;
      psVar14 = (size_type *)(plVar16 + 2);
      if ((size_type *)*plVar16 == psVar14) {
        local_400._16_8_ = *psVar14;
        local_400._24_8_ = plVar16[3];
      }
      else {
        local_400._16_8_ = *psVar14;
        local_400._0_8_ = (size_type *)*plVar16;
      }
      local_400._8_8_ = plVar16[1];
      *plVar16 = (long)psVar14;
      plVar16[1] = 0;
      *(undefined1 *)(plVar16 + 2) = 0;
      local_428._M_dataplus._M_p = (pointer)&local_428.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_428," of total time","");
      plVar16 = (long *)std::__cxx11::string::replace((ulong)&local_428,0,(char *)0x0,0x675237);
      local_488._M_dataplus._M_p = (pointer)&local_488.field_2;
      psVar14 = (size_type *)(plVar16 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar16 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar14) {
        local_488.field_2._M_allocated_capacity = *psVar14;
        local_488.field_2._8_4_ = (undefined4)plVar16[3];
        local_488.field_2._12_4_ = *(undefined4 *)((long)(plVar16 + 3) + 4);
      }
      else {
        local_488.field_2._M_allocated_capacity = *psVar14;
        local_488._M_dataplus._M_p = (pointer)*plVar16;
      }
      local_488._M_string_length = plVar16[1];
      *plVar16 = (long)psVar14;
      plVar16[1] = 0;
      *(undefined1 *)(plVar16 + 2) = 0;
      local_448._M_dataplus._M_p = (pointer)&local_448.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_448,"");
      fVar26 = vectorFloatRelativeStandardDeviation<long>(&local_3c0);
      tcu::LogNumber<float>::LogNumber
                ((LogNumber<float> *)local_318,(string *)local_400,&local_488,&local_448,
                 QP_KEY_TAG_NONE,fVar26);
      tcu::TestLog::writeFloat
                (local_408,(char *)local_318,(char *)local_308._16_8_,(char *)local_2e8._16_8_,
                 local_2b8,local_2b4);
      if ((long *)local_2e8._16_8_ != local_2c8) {
        operator_delete((void *)local_2e8._16_8_,local_2c8[0] + 1);
      }
      if ((undefined1 *)local_308._16_8_ != local_2e8) {
        operator_delete((void *)local_308._16_8_,local_2e8._0_8_ + 1);
      }
      if (local_318 != (undefined1  [8])local_308) {
        operator_delete((void *)local_318,local_308._0_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_448._M_dataplus._M_p != &local_448.field_2) {
        operator_delete(local_448._M_dataplus._M_p,local_448.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_488._M_dataplus._M_p != &local_488.field_2) {
        operator_delete(local_488._M_dataplus._M_p,local_488.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_428._M_dataplus._M_p != &local_428.field_2) {
        operator_delete(local_428._M_dataplus._M_p,local_428.field_2._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_400._0_8_ != local_400 + 0x10) {
        operator_delete((void *)local_400._0_8_,local_400._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_468._M_dataplus._M_p != &local_468.field_2) {
        operator_delete(local_468._M_dataplus._M_p,local_468.field_2._M_allocated_capacity + 1);
      }
      local_468._M_dataplus._M_p = (pointer)&local_468.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_468,local_3a0._0_8_,(pointer)(local_3a0._0_8_ + local_3a0._8_8_));
      std::__cxx11::string::append((char *)&local_468);
      plVar16 = (long *)std::__cxx11::string::append((char *)&local_468);
      local_400._0_8_ = local_400 + 0x10;
      psVar14 = (size_type *)(plVar16 + 2);
      if ((size_type *)*plVar16 == psVar14) {
        local_400._16_8_ = *psVar14;
        local_400._24_8_ = plVar16[3];
      }
      else {
        local_400._16_8_ = *psVar14;
        local_400._0_8_ = (size_type *)*plVar16;
      }
      local_400._8_8_ = plVar16[1];
      *plVar16 = (long)psVar14;
      plVar16[1] = 0;
      *(undefined1 *)(plVar16 + 2) = 0;
      local_428._M_dataplus._M_p = (pointer)&local_428.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_428," of total time","");
      plVar16 = (long *)std::__cxx11::string::replace((ulong)&local_428,0,(char *)0x0,0x675253);
      local_488._M_dataplus._M_p = (pointer)&local_488.field_2;
      psVar14 = (size_type *)(plVar16 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar16 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar14) {
        local_488.field_2._M_allocated_capacity = *psVar14;
        local_488.field_2._8_4_ = (undefined4)plVar16[3];
        local_488.field_2._12_4_ = *(undefined4 *)((long)(plVar16 + 3) + 4);
      }
      else {
        local_488.field_2._M_allocated_capacity = *psVar14;
        local_488._M_dataplus._M_p = (pointer)*plVar16;
      }
      local_488._M_string_length = plVar16[1];
      *plVar16 = (long)psVar14;
      plVar16[1] = 0;
      *(undefined1 *)(plVar16 + 2) = 0;
      local_448._M_dataplus._M_p = (pointer)&local_448.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_448,"ms","");
      fVar26 = vectorFloatMaximumMinusMinimum<long>(&local_3c0);
      tcu::LogNumber<float>::LogNumber
                ((LogNumber<float> *)local_318,(string *)local_400,&local_488,&local_448,
                 QP_KEY_TAG_TIME,fVar26 / 1000.0);
      tcu::TestLog::writeFloat
                (local_408,(char *)local_318,(char *)local_308._16_8_,(char *)local_2e8._16_8_,
                 local_2b8,local_2b4);
      if ((long *)local_2e8._16_8_ != local_2c8) {
        operator_delete((void *)local_2e8._16_8_,local_2c8[0] + 1);
      }
      if ((undefined1 *)local_308._16_8_ != local_2e8) {
        operator_delete((void *)local_308._16_8_,local_2e8._0_8_ + 1);
      }
      if (local_318 != (undefined1  [8])local_308) {
        operator_delete((void *)local_318,local_308._0_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_448._M_dataplus._M_p != &local_448.field_2) {
        operator_delete(local_448._M_dataplus._M_p,local_448.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_488._M_dataplus._M_p != &local_488.field_2) {
        operator_delete(local_488._M_dataplus._M_p,local_488.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_428._M_dataplus._M_p != &local_428.field_2) {
        operator_delete(local_428._M_dataplus._M_p,local_428.field_2._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_400._0_8_ != local_400 + 0x10) {
        operator_delete((void *)local_400._0_8_,local_400._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_468._M_dataplus._M_p != &local_468.field_2) {
        operator_delete(local_468._M_dataplus._M_p,local_468.field_2._M_allocated_capacity + 1);
      }
      local_468._M_dataplus._M_p = (pointer)&local_468.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_468,local_3a0._0_8_,(pointer)(local_3a0._0_8_ + local_3a0._8_8_));
      std::__cxx11::string::append((char *)&local_468);
      plVar16 = (long *)std::__cxx11::string::append((char *)&local_468);
      local_400._0_8_ = local_400 + 0x10;
      pMVar23 = (pointer)(plVar16 + 2);
      if ((pointer)*plVar16 == pMVar23) {
        local_400._16_8_ = pMVar23->sourceSetTime;
        local_400._24_8_ = plVar16[3];
      }
      else {
        local_400._16_8_ = pMVar23->sourceSetTime;
        local_400._0_8_ = (pointer)*plVar16;
      }
      local_400._8_8_ = plVar16[1];
      *plVar16 = (long)pMVar23;
      plVar16[1] = 0;
      *(undefined1 *)(plVar16 + 2) = 0;
      local_428._M_dataplus._M_p = (pointer)&local_428.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_428," of total time","");
      plVar16 = (long *)std::__cxx11::string::replace((ulong)&local_428,0,(char *)0x0,0x67526f);
      local_488._M_dataplus._M_p = (pointer)&local_488.field_2;
      psVar14 = (size_type *)(plVar16 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar16 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar14) {
        local_488.field_2._M_allocated_capacity = *psVar14;
        local_488.field_2._8_4_ = (undefined4)plVar16[3];
        local_488.field_2._12_4_ = *(undefined4 *)((long)(plVar16 + 3) + 4);
      }
      else {
        local_488.field_2._M_allocated_capacity = *psVar14;
        local_488._M_dataplus._M_p = (pointer)*plVar16;
      }
      local_488._M_string_length = plVar16[1];
      *plVar16 = (long)psVar14;
      plVar16[1] = 0;
      *(undefined1 *)(plVar16 + 2) = 0;
      local_448._M_dataplus._M_p = (pointer)&local_448.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_448,"");
      fVar26 = vectorFloatRelativeMaximumMinusMinimum<long>(&local_3c0);
      tcu::LogNumber<float>::LogNumber
                ((LogNumber<float> *)local_318,(string *)local_400,&local_488,&local_448,
                 QP_KEY_TAG_NONE,fVar26);
      tcu::TestLog::writeFloat
                (local_408,(char *)local_318,(char *)local_308._16_8_,(char *)local_2e8._16_8_,
                 local_2b8,local_2b4);
      if ((long *)local_2e8._16_8_ != local_2c8) {
        operator_delete((void *)local_2e8._16_8_,local_2c8[0] + 1);
      }
      if ((undefined1 *)local_308._16_8_ != local_2e8) {
        operator_delete((void *)local_308._16_8_,local_2e8._0_8_ + 1);
      }
      if (local_318 != (undefined1  [8])local_308) {
        operator_delete((void *)local_318,local_308._0_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_448._M_dataplus._M_p != &local_448.field_2) {
        operator_delete(local_448._M_dataplus._M_p,local_448.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_488._M_dataplus._M_p != &local_488.field_2) {
        operator_delete(local_488._M_dataplus._M_p,local_488.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_428._M_dataplus._M_p != &local_428.field_2) {
        operator_delete(local_428._M_dataplus._M_p,local_428.field_2._M_allocated_capacity + 1);
      }
      if ((pointer)local_400._0_8_ != (pointer)(local_400 + 0x10)) {
        operator_delete((void *)local_400._0_8_,local_400._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_468._M_dataplus._M_p != &local_468.field_2) {
        operator_delete(local_468._M_dataplus._M_p,local_468.field_2._M_allocated_capacity + 1);
      }
      if (iVar7 != 0) {
        fVar26 = vectorFloatMedianAbsoluteDeviation<long>(&local_3c0);
        local_168 = (code *)CONCAT44(local_168._4_4_,fVar26);
        fVar26 = vectorFloatMedian<long>(&local_3c0);
        if (((fVar26 != 0.0) || (NAN(fVar26))) && (0.05 < (float)local_168 / fVar26)) {
          local_318 = (undefined1  [8])local_408;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_310);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_310,
                     "\nWARNING: couldn\'t achieve relative median absolute deviation under threshold value "
                     ,0x54);
          std::ostream::_M_insert<double>(0.05000000074505806);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_318,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_310);
          std::ios_base::~ios_base(local_2a0);
        }
      }
      if ((pointer *)
          local_3c0.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer *)0x0) {
        operator_delete(local_3c0.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_3c0.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_3c0.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if ((undefined1 *)local_3a0._0_8_ != local_3a0 + 0x10) {
        operator_delete((void *)local_3a0._0_8_,CONCAT71(local_3a0._17_7_,local_3a0[0x10]) + 1);
      }
      bVar6 = iVar7 == 0;
      iVar7 = iVar7 + 1;
    } while (bVar6);
    tcu::TestLog::endSection(local_408);
    uVar19 = 0;
    do {
      pcVar21 = "Average";
      if (uVar19 == 0) {
        pcVar21 = "Median";
      }
      local_3a0._0_8_ = local_3a0 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_3a0,pcVar21,pcVar21 + ((ulong)(uVar19 == 0) ^ 7));
      local_400._0_8_ = local_400 + 0x10;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_400,local_3a0._0_8_,(pointer)(local_3a0._0_8_ + local_3a0._8_8_));
      std::__cxx11::string::append((char *)local_400);
      local_168 = vectorFloatAverage<long>;
      if (uVar19 == 0) {
        local_168 = vectorFloatMedian<long>;
      }
      local_468._M_dataplus._M_p = (pointer)&local_468.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_468,local_400._0_8_,(pointer)(local_400._0_8_ + local_400._8_8_));
      std::__cxx11::string::append((char *)&local_468);
      local_488._M_dataplus._M_p = (pointer)&local_488.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_488,local_400._0_8_,(pointer)(local_400._0_8_ + local_400._8_8_));
      std::__cxx11::string::append((char *)&local_488);
      tcu::LogSection::LogSection((LogSection *)local_318,&local_468,&local_488);
      tcu::TestLog::startSection(local_408,(char *)local_318,(char *)local_308._16_8_);
      if ((undefined1 *)local_308._16_8_ != local_2e8) {
        operator_delete((void *)local_308._16_8_,local_2e8._0_8_ + 1);
      }
      if (local_318 != (undefined1  [8])local_308) {
        operator_delete((void *)local_318,local_308._0_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_488._M_dataplus._M_p != &local_488.field_2) {
        operator_delete(local_488._M_dataplus._M_p,local_488.field_2._M_allocated_capacity + 1);
      }
      local_38 = (ulong)uVar19;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_468._M_dataplus._M_p != &local_468.field_2) {
        operator_delete(local_468._M_dataplus._M_p,local_468.field_2._M_allocated_capacity + 1);
      }
      iVar7 = 1;
      do {
        pcVar21 = "LowestHalf";
        if (iVar7 == 1) {
          pcVar21 = "";
        }
        local_468._M_dataplus._M_p = (pointer)&local_468.field_2;
        pcVar18 = pcVar21 + 10;
        if (iVar7 == 1) {
          pcVar18 = pcVar21;
        }
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_468,pcVar21,pcVar18);
        local_318 = (undefined1  [8])local_408;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_310);
        pcVar21 = "\nFor only the lowest 50% of the measurements:";
        if (iVar7 == 1) {
          pcVar21 = "For all measurements:";
        }
        lVar9 = 0x2d;
        if (iVar7 == 1) {
          lVar9 = 0x15;
        }
        local_dc = iVar7;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_310,pcVar21,lVar9);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_318,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_310);
        std::ios_base::~ios_base(local_2a0);
        local_428._M_dataplus._M_p = (pointer)&local_428.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_428,local_468._M_dataplus._M_p,
                   local_468._M_dataplus._M_p + local_468._M_string_length);
        std::__cxx11::string::append((char *)&local_428);
        plVar16 = (long *)std::__cxx11::string::_M_append((char *)&local_428,local_3a0._0_8_);
        local_488._M_dataplus._M_p = (pointer)&local_488.field_2;
        psVar14 = (size_type *)(plVar16 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar16 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar14) {
          local_488.field_2._M_allocated_capacity = *psVar14;
          local_488.field_2._8_4_ = (undefined4)plVar16[3];
          local_488.field_2._12_4_ = *(undefined4 *)((long)(plVar16 + 3) + 4);
        }
        else {
          local_488.field_2._M_allocated_capacity = *psVar14;
          local_488._M_dataplus._M_p = (pointer)*plVar16;
        }
        local_488._M_string_length = plVar16[1];
        *plVar16 = (long)psVar14;
        plVar16[1] = 0;
        *(undefined1 *)(plVar16 + 2) = 0;
        local_3c0.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)&local_3c0.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_3c0,local_3a0._0_8_,(pointer)(local_3a0._0_8_ + local_3a0._8_8_)
                  );
        std::__cxx11::string::append((char *)&local_3c0);
        plVar16 = (long *)std::__cxx11::string::append((char *)&local_3c0);
        local_448._M_dataplus._M_p = (pointer)&local_448.field_2;
        psVar14 = (size_type *)(plVar16 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar16 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar14) {
          local_448.field_2._M_allocated_capacity = *psVar14;
          local_448.field_2._8_8_ = plVar16[3];
        }
        else {
          local_448.field_2._M_allocated_capacity = *psVar14;
          local_448._M_dataplus._M_p = (pointer)*plVar16;
        }
        local_448._M_string_length = plVar16[1];
        *plVar16 = (long)psVar14;
        plVar16[1] = 0;
        *(undefined1 *)(plVar16 + 2) = 0;
        local_338._M_dataplus._M_p = (pointer)&local_338.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_338,"ms","");
        local_16c = *(float *)(&DAT_00674c20 + (ulong)(iVar7 == 1) * 4);
        vectorLowestPercentage<long>(&local_140,&local_98,local_16c);
        fVar26 = (float)(*local_168)(&local_140);
        tcu::LogNumber<float>::LogNumber
                  ((LogNumber<float> *)local_318,&local_488,&local_448,&local_338,QP_KEY_TAG_TIME,
                   fVar26 / 1000.0);
        tcu::TestLog::writeFloat
                  (local_408,(char *)local_318,(char *)local_308._16_8_,(char *)local_2e8._16_8_,
                   local_2b8,local_2b4);
        if ((long *)local_2e8._16_8_ != local_2c8) {
          operator_delete((void *)local_2e8._16_8_,local_2c8[0] + 1);
        }
        if ((undefined1 *)local_308._16_8_ != local_2e8) {
          operator_delete((void *)local_308._16_8_,local_2e8._0_8_ + 1);
        }
        if (local_318 != (undefined1  [8])local_308) {
          operator_delete((void *)local_318,local_308._0_8_ + 1);
        }
        if (local_140.super__Vector_base<long,_std::allocator<long>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_140.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_140.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_140.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_338._M_dataplus._M_p != &local_338.field_2) {
          operator_delete(local_338._M_dataplus._M_p,local_338.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_448._M_dataplus._M_p != &local_448.field_2) {
          operator_delete(local_448._M_dataplus._M_p,local_448.field_2._M_allocated_capacity + 1);
        }
        if ((pointer *)
            local_3c0.super__Vector_base<long,_std::allocator<long>_>._M_impl.
            super__Vector_impl_data._M_start !=
            &local_3c0.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage) {
          operator_delete(local_3c0.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_3c0.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_488._M_dataplus._M_p != &local_488.field_2) {
          operator_delete(local_488._M_dataplus._M_p,local_488.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_428._M_dataplus._M_p != &local_428.field_2) {
          operator_delete(local_428._M_dataplus._M_p,local_428.field_2._M_allocated_capacity + 1);
        }
        local_428._M_dataplus._M_p = (pointer)&local_428.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_428,local_468._M_dataplus._M_p,
                   local_468._M_dataplus._M_p + local_468._M_string_length);
        std::__cxx11::string::append((char *)&local_428);
        plVar16 = (long *)std::__cxx11::string::_M_append((char *)&local_428,local_3a0._0_8_);
        local_488._M_dataplus._M_p = (pointer)&local_488.field_2;
        psVar14 = (size_type *)(plVar16 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar16 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar14) {
          local_488.field_2._M_allocated_capacity = *psVar14;
          local_488.field_2._8_4_ = (undefined4)plVar16[3];
          local_488.field_2._12_4_ = *(undefined4 *)((long)(plVar16 + 3) + 4);
        }
        else {
          local_488.field_2._M_allocated_capacity = *psVar14;
          local_488._M_dataplus._M_p = (pointer)*plVar16;
        }
        local_488._M_string_length = plVar16[1];
        *plVar16 = (long)psVar14;
        plVar16[1] = 0;
        *(undefined1 *)(plVar16 + 2) = 0;
        local_3c0.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)&local_3c0.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_3c0,local_3a0._0_8_,(pointer)(local_3a0._0_8_ + local_3a0._8_8_)
                  );
        std::__cxx11::string::append((char *)&local_3c0);
        plVar16 = (long *)std::__cxx11::string::append((char *)&local_3c0);
        local_448._M_dataplus._M_p = (pointer)&local_448.field_2;
        psVar14 = (size_type *)(plVar16 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar16 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar14) {
          local_448.field_2._M_allocated_capacity = *psVar14;
          local_448.field_2._8_8_ = plVar16[3];
        }
        else {
          local_448.field_2._M_allocated_capacity = *psVar14;
          local_448._M_dataplus._M_p = (pointer)*plVar16;
        }
        local_448._M_string_length = plVar16[1];
        *plVar16 = (long)psVar14;
        plVar16[1] = 0;
        *(undefined1 *)(plVar16 + 2) = 0;
        local_338._M_dataplus._M_p = (pointer)&local_338.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_338,"ms","");
        vectorLowestPercentage<long>(&local_140,&local_b8,local_16c);
        fVar26 = (float)(*local_168)(&local_140);
        tcu::LogNumber<float>::LogNumber
                  ((LogNumber<float> *)local_318,&local_488,&local_448,&local_338,QP_KEY_TAG_TIME,
                   fVar26 / 1000.0);
        tcu::TestLog::writeFloat
                  (local_408,(char *)local_318,(char *)local_308._16_8_,(char *)local_2e8._16_8_,
                   local_2b8,local_2b4);
        if ((long *)local_2e8._16_8_ != local_2c8) {
          operator_delete((void *)local_2e8._16_8_,local_2c8[0] + 1);
        }
        if ((undefined1 *)local_308._16_8_ != local_2e8) {
          operator_delete((void *)local_308._16_8_,local_2e8._0_8_ + 1);
        }
        if (local_318 != (undefined1  [8])local_308) {
          operator_delete((void *)local_318,local_308._0_8_ + 1);
        }
        if (local_140.super__Vector_base<long,_std::allocator<long>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_140.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_140.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_140.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_338._M_dataplus._M_p != &local_338.field_2) {
          operator_delete(local_338._M_dataplus._M_p,local_338.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_448._M_dataplus._M_p != &local_448.field_2) {
          operator_delete(local_448._M_dataplus._M_p,local_448.field_2._M_allocated_capacity + 1);
        }
        if ((pointer *)
            local_3c0.super__Vector_base<long,_std::allocator<long>_>._M_impl.
            super__Vector_impl_data._M_start !=
            &local_3c0.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage) {
          operator_delete(local_3c0.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_3c0.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_488._M_dataplus._M_p != &local_488.field_2) {
          operator_delete(local_488._M_dataplus._M_p,local_488.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_428._M_dataplus._M_p != &local_428.field_2) {
          operator_delete(local_428._M_dataplus._M_p,local_428.field_2._M_allocated_capacity + 1);
        }
        local_428._M_dataplus._M_p = (pointer)&local_428.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_428,local_468._M_dataplus._M_p,
                   local_468._M_dataplus._M_p + local_468._M_string_length);
        std::__cxx11::string::append((char *)&local_428);
        plVar16 = (long *)std::__cxx11::string::_M_append((char *)&local_428,local_3a0._0_8_);
        local_488._M_dataplus._M_p = (pointer)&local_488.field_2;
        psVar14 = (size_type *)(plVar16 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar16 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar14) {
          local_488.field_2._M_allocated_capacity = *psVar14;
          local_488.field_2._8_4_ = (undefined4)plVar16[3];
          local_488.field_2._12_4_ = *(undefined4 *)((long)(plVar16 + 3) + 4);
        }
        else {
          local_488.field_2._M_allocated_capacity = *psVar14;
          local_488._M_dataplus._M_p = (pointer)*plVar16;
        }
        local_488._M_string_length = plVar16[1];
        *plVar16 = (long)psVar14;
        plVar16[1] = 0;
        *(undefined1 *)(plVar16 + 2) = 0;
        local_3c0.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)&local_3c0.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_3c0,local_3a0._0_8_,(pointer)(local_3a0._0_8_ + local_3a0._8_8_)
                  );
        std::__cxx11::string::append((char *)&local_3c0);
        plVar16 = (long *)std::__cxx11::string::append((char *)&local_3c0);
        local_448._M_dataplus._M_p = (pointer)&local_448.field_2;
        psVar14 = (size_type *)(plVar16 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar16 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar14) {
          local_448.field_2._M_allocated_capacity = *psVar14;
          local_448.field_2._8_8_ = plVar16[3];
        }
        else {
          local_448.field_2._M_allocated_capacity = *psVar14;
          local_448._M_dataplus._M_p = (pointer)*plVar16;
        }
        local_448._M_string_length = plVar16[1];
        *plVar16 = (long)psVar14;
        plVar16[1] = 0;
        *(undefined1 *)(plVar16 + 2) = 0;
        local_338._M_dataplus._M_p = (pointer)&local_338.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_338,"ms","");
        vectorLowestPercentage<long>(&local_140,&local_d8,local_16c);
        fVar26 = (float)(*local_168)(&local_140);
        tcu::LogNumber<float>::LogNumber
                  ((LogNumber<float> *)local_318,&local_488,&local_448,&local_338,QP_KEY_TAG_TIME,
                   fVar26 / 1000.0);
        tcu::TestLog::writeFloat
                  (local_408,(char *)local_318,(char *)local_308._16_8_,(char *)local_2e8._16_8_,
                   local_2b8,local_2b4);
        if ((long *)local_2e8._16_8_ != local_2c8) {
          operator_delete((void *)local_2e8._16_8_,local_2c8[0] + 1);
        }
        if ((undefined1 *)local_308._16_8_ != local_2e8) {
          operator_delete((void *)local_308._16_8_,local_2e8._0_8_ + 1);
        }
        if (local_318 != (undefined1  [8])local_308) {
          operator_delete((void *)local_318,local_308._0_8_ + 1);
        }
        if (local_140.super__Vector_base<long,_std::allocator<long>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_140.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_140.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_140.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_338._M_dataplus._M_p != &local_338.field_2) {
          operator_delete(local_338._M_dataplus._M_p,local_338.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_448._M_dataplus._M_p != &local_448.field_2) {
          operator_delete(local_448._M_dataplus._M_p,local_448.field_2._M_allocated_capacity + 1);
        }
        if ((pointer *)
            local_3c0.super__Vector_base<long,_std::allocator<long>_>._M_impl.
            super__Vector_impl_data._M_start !=
            &local_3c0.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage) {
          operator_delete(local_3c0.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_3c0.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_488._M_dataplus._M_p != &local_488.field_2) {
          operator_delete(local_488._M_dataplus._M_p,local_488.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_428._M_dataplus._M_p != &local_428.field_2) {
          operator_delete(local_428._M_dataplus._M_p,local_428.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_468._M_dataplus._M_p != &local_468.field_2) {
          operator_delete(local_468._M_dataplus._M_p,local_468.field_2._M_allocated_capacity + 1);
        }
        iVar7 = local_dc + -1;
      } while (iVar7 == 0);
      tcu::TestLog::endSection(local_408);
      pIVar25 = local_178;
      if ((pointer)local_400._0_8_ != (pointer)(local_400 + 0x10)) {
        operator_delete((void *)local_400._0_8_,local_400._16_8_ + 1);
      }
      if ((pointer)local_3a0._0_8_ != (pointer)(local_3a0 + 0x10)) {
        operator_delete((void *)local_3a0._0_8_,CONCAT71(local_3a0._17_7_,local_3a0[0x10]) + 1);
      }
      uVar19 = (int)local_38 + 1;
    } while ((int)local_38 == 0);
    local_318 = (undefined1  [8])local_408;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_310);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_310,
               "Note: test result is the first quartile (i.e. median of the lowest half of measurements) of total times"
               ,0x67);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_318,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_310);
    std::ios_base::~ios_base(local_2a0);
    fVar26 = vectorFloatFirstQuartile<long>(&local_158);
    this_00 = (pIVar25->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    de::floatToString_abi_cxx11_((string *)local_318,(de *)0x2,fVar26 / 1000.0,precision);
    tcu::TestContext::setTestResult(this_00,QP_TEST_RESULT_PASS,(char *)local_318);
    if (local_318 != (undefined1  [8])local_308) {
      operator_delete((void *)local_318,local_308._0_8_ + 1);
    }
    local_318 = (undefined1  [8])local_408;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_310);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_310,
               "Note: the following shaders are the ones from the last iteration; variables\' names and some constant expressions differ between iterations."
               ,0x8b);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_318,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_310);
    std::ios_base::~ios_base(local_2a0);
    logProgramData(pIVar25,(BuildInfo *)local_128,(ProgramContext *)local_78);
    if (local_158.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_158.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_158.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_158.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_d8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_d8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_d8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_d8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_b8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_b8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_b8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_b8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if ((pointer)local_98.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                 super__Vector_impl_data._M_start != (pointer)0x0) {
      uVar20 = (long)local_98.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage -
               (long)local_98.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                     super__Vector_impl_data._M_start;
      pMVar23 = (pointer)local_98.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                         super__Vector_impl_data._M_start;
LAB_00450510:
      operator_delete(pMVar23,uVar20);
    }
LAB_00450515:
    if (local_100._M_p != local_f8 + 8) {
      operator_delete(local_100._M_p,CONCAT71(local_f8._9_7_,local_f8[8]) + 1);
    }
    if (local_120 != (Shaders)((long)local_118 + 8)) {
      operator_delete((void *)local_120,CONCAT71(local_118._9_7_,local_118[8]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_p != &local_48) {
      operator_delete(local_58._M_p,
                      CONCAT71(local_48._M_allocated_capacity._1_7_,local_48._M_local_buf[0]) + 1);
    }
    if (local_78._0_8_ != (long)local_78 + 0x10) {
      operator_delete((void *)local_78._0_8_,CONCAT71(local_78._17_7_,local_78[0x10]) + 1);
    }
    if (local_198.
        super__Vector_base<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement>_>
        ._M_impl.super__Vector_impl_data._M_start == (pointer)0x0) {
      return STOP;
    }
    uVar20 = (long)local_198.
                   super__Vector_base<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage -
             (long)local_198.
                   super__Vector_base<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    pMVar23 = local_198.
              super__Vector_base<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement>_>
              ._M_impl.super__Vector_impl_data._M_start;
  }
  operator_delete(pMVar23,uVar20);
  return STOP;
}

Assistant:

InvalidShaderCompilerCase::IterateResult InvalidShaderCompilerCase::iterate (void)
{
	ShaderValidity shaderValidity = m_invalidityType == INVALIDITY_INVALID_CHAR		? SHADER_VALIDITY_INVALID_CHAR
								  : m_invalidityType == INVALIDITY_SEMANTIC_ERROR	? SHADER_VALIDITY_SEMANTIC_ERROR
								  : SHADER_VALIDITY_LAST;

	DE_ASSERT(shaderValidity != SHADER_VALIDITY_LAST);

	// Before actual measurements, compile a dummy shader to avoid possible initial slowdowns in the actual test.
	{
		deUint32		specID = getSpecializationID(0);
		ProgramContext	progCtx;
		progCtx.vertShaderSource = specializeShaderSource(singleVaryingVertexTemplate(), specID, shaderValidity);
		progCtx.fragShaderSource = specializeShaderSource(singleVaryingFragmentTemplate(), specID, shaderValidity);

		Shaders shaders = createShaders();
		setShaderSources(shaders, progCtx);

		BuildInfo buildInfo;
		buildInfo.vertCompileSuccess = compileShader(shaders.vertShader);
		buildInfo.fragCompileSuccess = compileShader(shaders.fragShader);
		if (buildInfo.vertCompileSuccess || buildInfo.fragCompileSuccess)
		{
			buildInfo.logs = getLogs(shaders);
			logProgramData(buildInfo, progCtx);
			cleanup(shaders);
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Compilation of a shader erroneously succeeded");
			return STOP;
		}
		cleanup(shaders);
	}

	vector<Measurement>		measurements;
	// \note These are logged after measurements are done.
	ProgramContext			latestProgramContext;
	BuildInfo				latestBuildInfo;

	if (WARMUP_CPU_AT_BEGINNING_OF_CASE)
		tcu::warmupCPU();

	// Actual test measurements.
	while (!goodEnoughMeasurements(measurements))
	{
		// Create shader and compile. Measure time.

		// \note Shader sources are generated and GL shader objects are created before any time measurements.
		ProgramContext	progCtx		= generateShaderSources((int)measurements.size());
		Shaders			shaders		= createShaders();
		BuildInfo		buildInfo;

		if (WARMUP_CPU_BEFORE_EACH_MEASUREMENT)
			tcu::warmupCPU();

		// \note Do NOT do anything too hefty between the first and last deGetMicroseconds() here (other than the gl calls); it would disturb the measurement.

		deUint64 startTime = deGetMicroseconds();

		setShaderSources(shaders, progCtx);
		deUint64 shaderSourceSetEndTime = deGetMicroseconds();

		buildInfo.vertCompileSuccess = compileShader(shaders.vertShader);
		deUint64 vertexShaderCompileEndTime = deGetMicroseconds();

		buildInfo.fragCompileSuccess = compileShader(shaders.fragShader);
		deUint64 fragmentShaderCompileEndTime = deGetMicroseconds();

		buildInfo.logs = getLogs(shaders);

		// Both shader compilations should have failed.
		if (buildInfo.vertCompileSuccess || buildInfo.fragCompileSuccess)
		{
			logProgramData(buildInfo, progCtx);
			cleanup(shaders);
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Compilation of a shader erroneously succeeded");
			return STOP;
		}

		// De-initializations (delete shaders).

		cleanup(shaders);

		// Output measurement log later (after last measurement).

		measurements.push_back(Measurement((deInt64)(shaderSourceSetEndTime			- startTime),
										   (deInt64)(vertexShaderCompileEndTime		- shaderSourceSetEndTime),
										   (deInt64)(fragmentShaderCompileEndTime	- vertexShaderCompileEndTime)));

		latestBuildInfo			= buildInfo;
		latestProgramContext	= progCtx;

		m_testCtx.touchWatchdog(); // \note Measurements may take a while in a bad case.
	}

	// End of test case, log information about measurements.
	{
		TestLog& log = m_testCtx.getLog();

		vector<deInt64> sourceSetTimes;
		vector<deInt64> vertexCompileTimes;
		vector<deInt64> fragmentCompileTimes;
		vector<deInt64> totalTimes;

		log << TestLog::Section("IterationMeasurements", "Iteration measurements of compilation times");

		for (int ndx = 0; ndx < (int)measurements.size(); ndx++)
		{
			sourceSetTimes.push_back		(measurements[ndx].sourceSetTime);
			vertexCompileTimes.push_back	(measurements[ndx].vertexCompileTime);
			fragmentCompileTimes.push_back	(measurements[ndx].fragmentCompileTime);
			totalTimes.push_back			(measurements[ndx].totalTime());

			// Log this measurement.
			log << TestLog::Float("Measurement" + de::toString(ndx) + "Time",
								  "Measurement " + de::toString(ndx) + " time",
								  "ms", QP_KEY_TAG_TIME, (float)measurements[ndx].totalTime()/1000.0f);
		}

		// Log some statistics.

		for (int entireRangeOrLowestHalf = 0; entireRangeOrLowestHalf < 2; entireRangeOrLowestHalf++)
		{
			bool				isEntireRange	= entireRangeOrLowestHalf == 0;
			string				statNamePrefix	= isEntireRange ? "" : "LowestHalf";
			vector<deInt64>		rangeTimes		= isEntireRange ? totalTimes : vectorLowestPercentage(totalTimes, 0.5f);

			log << TestLog::Message << "\nStatistics computed from "
									<< (isEntireRange ? "all" : "only the lowest 50%")
									<< " of the above measurements:"
									<< TestLog::EndMessage;

#define LOG_TIME_STAT(NAME, DESC, FUNC)			log << TestLog::Float(statNamePrefix + "TotalTime" + (NAME), (DESC) + string(" of total time"), "ms",	QP_KEY_TAG_TIME, (FUNC)(rangeTimes)/1000.0f)
#define LOG_RELATIVE_STAT(NAME, DESC, FUNC)		log << TestLog::Float(statNamePrefix + "TotalTime" + (NAME), (DESC) + string(" of total time"), "",		QP_KEY_TAG_NONE, (FUNC)(rangeTimes))

			LOG_TIME_STAT		("Median",							"Median",								vectorFloatMedian);
			LOG_TIME_STAT		("Average",							"Average",								vectorFloatAverage);
			LOG_TIME_STAT		("Minimum",							"Minimum",								vectorFloatMinimum);
			LOG_TIME_STAT		("Maximum",							"Maximum",								vectorFloatMaximum);
			LOG_TIME_STAT		("MedianAbsoluteDeviation",			"Median absolute deviation",			vectorFloatMedianAbsoluteDeviation);
			LOG_RELATIVE_STAT	("RelativeMedianAbsoluteDeviation",	"Relative median absolute deviation",	vectorFloatRelativeMedianAbsoluteDeviation);
			LOG_TIME_STAT		("StandardDeviation",				"Standard deviation",					vectorFloatStandardDeviation);
			LOG_RELATIVE_STAT	("RelativeStandardDeviation",		"Relative standard deviation",			vectorFloatRelativeStandardDeviation);
			LOG_TIME_STAT		("MaxMinusMin",						"Max-min",								vectorFloatMaximumMinusMinimum);
			LOG_RELATIVE_STAT	("RelativeMaxMinusMin",				"Relative max-min",						vectorFloatRelativeMaximumMinusMinimum);

#undef LOG_TIME_STAT
#undef LOG_RELATIVE_STAT

			if (!isEntireRange && vectorFloatRelativeMedianAbsoluteDeviation(rangeTimes) > RELATIVE_MEDIAN_ABSOLUTE_DEVIATION_THRESHOLD)
				log << TestLog::Message << "\nWARNING: couldn't achieve relative median absolute deviation under threshold value " << RELATIVE_MEDIAN_ABSOLUTE_DEVIATION_THRESHOLD << TestLog::EndMessage;
		}

		log << TestLog::EndSection; // End section IterationMeasurements

		for (int medianOrAverage = 0; medianOrAverage < 2; medianOrAverage++)
		{
			typedef float (*VecFunc)(const vector<deInt64>&);

			bool	isMedian						= medianOrAverage == 0;
			string	singular						= isMedian ? "Median" : "Average";
			string	plural							= singular + "s";
			VecFunc func							= isMedian ? (VecFunc) vectorFloatMedian<deInt64> : (VecFunc) vectorFloatAverage<deInt64>;

			log << TestLog::Section(plural + "PerPhase", plural + " per phase");

			for (int entireRangeOrLowestHalf = 0; entireRangeOrLowestHalf < 2; entireRangeOrLowestHalf++)
			{
				bool	isEntireRange	= entireRangeOrLowestHalf == 0;
				string	statNamePrefix	= isEntireRange ? "" : "LowestHalf";
				float	rangeSizeRatio	= isEntireRange ? 1.0f : 0.5f;

#define LOG_TIME(NAME, DESC, DATA) log << TestLog::Float(statNamePrefix + (NAME) + singular, singular + " of " + (DESC), "ms", QP_KEY_TAG_TIME, func(vectorLowestPercentage((DATA), rangeSizeRatio))/1000.0f);

				log << TestLog::Message << (isEntireRange ? "For all measurements:" : "\nFor only the lowest 50% of the measurements:") << TestLog::EndMessage;
				LOG_TIME("ShaderSourceSetTime",			"shader source set time",			sourceSetTimes);
				LOG_TIME("VertexShaderCompileTime",		"vertex shader compile time",		vertexCompileTimes);
				LOG_TIME("FragmentShaderCompileTime",	"fragment shader compile time",		fragmentCompileTimes);

#undef LOG_TIME
			}

			log << TestLog::EndSection;
		}

		// Set result.

		{
			log << TestLog::Message << "Note: test result is the first quartile (i.e. median of the lowest half of measurements) of total times" << TestLog::EndMessage;
			float result = vectorFloatFirstQuartile(totalTimes) / 1000.0f;
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, de::floatToString(result, 2).c_str());
		}

		// Log shaders.

		log << TestLog::Message << "Note: the following shaders are the ones from the last iteration; variables' names and some constant expressions differ between iterations." << TestLog::EndMessage;

		logProgramData(latestBuildInfo, latestProgramContext);

		return STOP;
	}
}